

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

string * __thiscall AST::toStringTree_abi_cxx11_(AST *this)

{
  AST *this_00;
  string *in_RDI;
  AST *in_stack_00000028;
  string *ts;
  AST *in_stack_ffffffffffffff38;
  string local_98 [32];
  RefCount<AST> local_78;
  string local_70 [32];
  string local_50 [32];
  RefCount local_30 [30];
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  getFirstChild(in_stack_ffffffffffffff38);
  this_00 = RefCount::operator_cast_to_AST_(local_30);
  RefCount<AST>::~RefCount(&this_00->down);
  if (this_00 == (AST *)0x0) {
    std::__cxx11::string::operator+=(in_RDI," ");
    toString_abi_cxx11_(in_stack_ffffffffffffff38);
    std::__cxx11::string::operator+=(in_RDI,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    std::__cxx11::string::operator+=(in_RDI," ( ");
    toString_abi_cxx11_(in_stack_ffffffffffffff38);
    std::__cxx11::string::operator+=(in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
    getFirstChild(in_stack_ffffffffffffff38);
    RefCount<AST>::operator->(&local_78);
    toStringList_abi_cxx11_(in_stack_00000028);
    std::__cxx11::string::operator+=(in_RDI,local_70);
    std::__cxx11::string::~string(local_70);
    RefCount<AST>::~RefCount(&this_00->down);
    std::__cxx11::string::operator+=(in_RDI," )");
  }
  return in_RDI;
}

Assistant:

std::string AST::toStringTree() const
{
	//const AST* t=this;
	std::string ts="";
	if (getFirstChild()) {
		ts+=" ( ";
		ts+=toString();
		ts+=getFirstChild()->toStringList();
		ts+=" )";
	} else {
		ts+=" ";
		ts+=toString();
	}
	return ts;
}